

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined4 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  void *p;
  long lVar4;
  long lVar5;
  elemental_vector *this;
  
  if (num != 0) {
    lVar5 = 0;
    do {
      puVar1 = (undefined4 *)((long)pDst_void + lVar5);
      this = (elemental_vector *)(puVar1 + 6);
      *puVar1 = *(undefined4 *)((long)pSrc_void + lVar5);
      puVar1[1] = *(undefined4 *)((long)pSrc_void + lVar5 + 4);
      *(undefined8 *)(puVar1 + 2) = *(undefined8 *)((long)pSrc_void + lVar5 + 8);
      puVar1[4] = *(undefined4 *)((long)pSrc_void + lVar5 + 0x10);
      this->m_p = (void *)0x0;
      *(undefined8 *)(puVar1 + 8) = 0;
      elemental_vector::increase_capacity
                (this,*(uint *)((long)pSrc_void + lVar5 + 0x20),false,4,(object_mover)0x0,false);
      uVar2 = *(uint *)((long)pSrc_void + lVar5 + 0x20);
      puVar1[8] = uVar2;
      memcpy(this->m_p,*(void **)((long)pSrc_void + lVar5 + 0x18),(ulong)uVar2 << 2);
      uVar3 = *(undefined8 *)((long)pSrc_void + lVar5 + 0x28);
      *(undefined8 *)((long)puVar1 + 0x2d) = *(undefined8 *)((long)pSrc_void + lVar5 + 0x2d);
      *(undefined8 *)(puVar1 + 10) = uVar3;
      p = *(void **)((long)pSrc_void + lVar5 + 0x18);
      if (p != (void *)0x0) {
        crnlib_free(p);
      }
      lVar4 = lVar5 + 0x38;
      lVar5 = lVar5 + 0x38;
    } while ((void *)((long)pSrc_void + lVar4) != (void *)((ulong)num * 0x38 + (long)pSrc_void));
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }